

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O0

void __thiscall QThreadData::clearEvents(QThreadData *this)

{
  bool bVar1;
  const_iterator o;
  QPostEvent *pQVar2;
  QList<QPostEvent> *in_RDI;
  long in_FS_OFFSET;
  QPostEvent *pe;
  add_const_t<QPostEventList> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QEvent *in_stack_ffffffffffffffb8;
  int valueToAdd;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.i = (QPostEvent *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QPostEvent>::begin(in_RDI);
  o = QList<QPostEvent>::end(in_RDI);
  while (bVar1 = QList<QPostEvent>::const_iterator::operator!=(&local_10,o), bVar1) {
    pQVar2 = QList<QPostEvent>::const_iterator::operator*(&local_10);
    valueToAdd = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
    if (pQVar2->event != (QEvent *)0x0) {
      QObject::d_func((QObject *)0x555e2c);
      QBasicAtomicInteger<int>::fetchAndSubRelaxed((QBasicAtomicInteger<int> *)in_RDI,valueToAdd);
      pQVar2->event->m_posted = false;
      in_stack_ffffffffffffffb8 = pQVar2->event;
      if (in_stack_ffffffffffffffb8 != (QEvent *)0x0) {
        (*in_stack_ffffffffffffffb8->_vptr_QEvent[1])();
      }
    }
    QList<QPostEvent>::const_iterator::operator++(&local_10);
  }
  QList<QPostEvent>::clear(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QThreadData::clearEvents()
{
    for (const auto &pe : std::as_const(postEventList)) {
        if (pe.event) {
            pe.receiver->d_func()->postedEvents.fetchAndSubRelaxed(1);
            pe.event->m_posted = false;
            delete pe.event;
        }
    }
    postEventList.clear();
}